

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QByteArray * QString::toUtf8_helper(QString *str)

{
  QStringView str_00;
  QString *in_RSI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  storage_type_conflict *in_stack_fffffffffffffff0;
  qsizetype qVar1;
  
  qVar1 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  QStringView::QStringView<QString,_true>(in_RDI,in_RSI);
  str_00.m_size = qVar1;
  str_00.m_data = in_stack_fffffffffffffff0;
  qt_convert_to_utf8(str_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == qVar1) {
    return (QByteArray *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QString::toUtf8_helper(const QString &str)
{
    return qt_convert_to_utf8(str);
}